

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  SyntaxNode *args_2;
  SyntaxNode *args_4;
  MinTypMaxExpressionSyntax *pMVar1;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_49;
  Token local_48;
  Token local_38;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_38,
                    (BumpAllocator *)__child_stack);
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x30),(DeepCloneVisitor *)&local_48,
                      (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x38),(BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x48),&local_49,(BumpAllocator *)__child_stack);
  pMVar1 = BumpAllocator::
           emplace<slang::syntax::MinTypMaxExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
                     ((BumpAllocator *)__child_stack,(ExpressionSyntax *)args,&local_38,
                      (ExpressionSyntax *)args_2,&local_48,(ExpressionSyntax *)args_4);
  return (int)pMVar1;
}

Assistant:

static SyntaxNode* clone(const MinTypMaxExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<MinTypMaxExpressionSyntax>(
        *deepClone<ExpressionSyntax>(*node.min, alloc),
        node.colon1.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.typ, alloc),
        node.colon2.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.max, alloc)
    );
}